

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::CanonicalIterator::getEquivalents
          (CanonicalIterator *this,UnicodeString *segment,int32_t *result_len,UErrorCode *status)

{
  UHashtable *pUVar1;
  short sVar2;
  int iVar3;
  int *piVar4;
  UBool UVar5;
  int32_t iVar6;
  UErrorCode UVar7;
  UHashElement *pUVar8;
  UnicodeString *pUVar9;
  UnicodeString *pUVar10;
  long *plVar11;
  long lVar12;
  undefined4 len;
  uint uVar13;
  int32_t *pos;
  UMemory *this_00;
  long lVar14;
  bool bVar15;
  int32_t el;
  int32_t el2;
  Hashtable permutations;
  Hashtable result;
  Hashtable basic;
  UnicodeString attempt;
  UnicodeString item;
  UnicodeString possible;
  UChar USeg [256];
  int32_t local_440 [2];
  UnicodeString *local_438;
  CanonicalIterator *local_430;
  Char16Ptr local_428;
  int *local_420;
  UErrorCode *local_418;
  char16_t *local_410;
  Hashtable local_400;
  UHashtable *local_3a8;
  UHashtable local_3a0;
  Hashtable local_350;
  UnicodeString local_2f8;
  UnicodeString local_2b8;
  UnicodeString local_278;
  char16_t local_238 [260];
  
  local_3a8 = (UHashtable *)0x0;
  local_438 = segment;
  local_430 = this;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_init_63(&local_3a0,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                  (undefined1 *)0x0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_3a8 = &local_3a0;
      uhash_setKeyDeleter_63(&local_3a0,uprv_deleteUObject_63);
    }
  }
  local_400.hash = (UHashtable *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = &local_400.hashObj;
    uhash_init_63(pUVar1,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,(undefined1 *)0x0,
                  status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_400.hash = pUVar1;
      uhash_setKeyDeleter_63(pUVar1,uprv_deleteUObject_63);
    }
  }
  local_350.hash = (UHashtable *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = &local_350.hashObj;
    uhash_init_63(pUVar1,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,(undefined1 *)0x0,
                  status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_350.hash = pUVar1;
      uhash_setKeyDeleter_63(pUVar1,uprv_deleteUObject_63);
    }
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_setValueDeleter_63(local_3a8,uprv_deleteUObject_63);
    uhash_setValueDeleter_63(local_400.hash,uprv_deleteUObject_63);
    uhash_setValueDeleter_63(local_350.hash,uprv_deleteUObject_63);
    local_428.p_ = local_238;
    iVar6 = icu_63::UnicodeString::extract(local_438,&local_428,0x100,status);
    local_410 = local_428.p_;
    local_420 = result_len;
    getEquivalents2(local_430,&local_350,local_238,iVar6,status);
    pos = local_440;
    local_440[0] = -1;
    pUVar8 = uhash_nextElement_63(local_350.hash,pos);
    if (pUVar8 != (UHashElement *)0x0) {
      local_418 = status;
      do {
        icu_63::UnicodeString::UnicodeString(&local_2b8,(UnicodeString *)(pUVar8->value).pointer);
        uhash_removeAll_63(local_400.hash);
        permute(&local_2b8,'\x01',&local_400,status);
        local_440[1] = 0xffffffff;
        pUVar8 = uhash_nextElement_63(local_400.hash,local_440 + 1);
        while (pUVar8 != (UHashElement *)0x0) {
          icu_63::UnicodeString::UnicodeString(&local_278,(UnicodeString *)(pUVar8->value).pointer);
          local_2f8.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_0048be70;
          local_2f8.fUnion.fStackFields.fLengthAndFlags = 2;
          pUVar10 = &local_278;
          (*(local_430->nfd->super_UObject)._vptr_UObject[3])
                    (local_430->nfd,&local_278,&local_2f8,status);
          if ((local_2f8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
            len = local_2f8.fUnion.fFields.fLength;
            if (-1 < local_2f8.fUnion.fStackFields.fLengthAndFlags) {
              len = (int)local_2f8.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            sVar2 = (local_438->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              uVar13 = (local_438->fUnion).fFields.fLength;
            }
            else {
              uVar13 = (int)sVar2 >> 5;
            }
            pUVar10 = (UnicodeString *)(ulong)uVar13;
            bVar15 = false;
            if ((((int)sVar2 & 1U) == 0) && (bVar15 = false, len == uVar13)) {
              pUVar10 = local_438;
              UVar5 = icu_63::UnicodeString::doEquals(&local_2f8,local_438,len);
              bVar15 = UVar5 != '\0';
            }
          }
          else {
            bVar15 = (bool)(*(byte *)&local_438->fUnion & 1);
          }
          if (bVar15 != false) {
            pUVar9 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar10);
            if (pUVar9 == (UnicodeString *)0x0) {
              pUVar9 = (UnicodeString *)0x0;
            }
            else {
              pUVar10 = &local_278;
              icu_63::UnicodeString::UnicodeString(pUVar9,&local_278);
            }
            pUVar1 = local_3a8;
            pUVar10 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar10);
            if (pUVar10 == (UnicodeString *)0x0) {
              pUVar10 = (UnicodeString *)0x0;
            }
            else {
              icu_63::UnicodeString::UnicodeString(pUVar10,&local_278);
            }
            status = local_418;
            uhash_put_63(pUVar1,pUVar10,pUVar9,local_418);
          }
          pUVar8 = uhash_nextElement_63(local_400.hash,local_440 + 1);
          icu_63::UnicodeString::~UnicodeString(&local_2f8);
          icu_63::UnicodeString::~UnicodeString(&local_278);
        }
        pos = local_440;
        pUVar8 = uhash_nextElement_63(local_350.hash,pos);
        icu_63::UnicodeString::~UnicodeString(&local_2b8);
      } while (pUVar8 != (UHashElement *)0x0);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar6 = uhash_count_63(local_3a8);
      piVar4 = local_420;
      if (iVar6 == 0) {
        UVar7 = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        lVar14 = (long)iVar6 * 0x40;
        this_00 = (UMemory *)0xffffffffffffffff;
        if (-1 < iVar6) {
          this_00 = (UMemory *)(lVar14 + 8);
        }
        plVar11 = (long *)UMemory::operator_new__(this_00,(size_t)pos);
        if (plVar11 == (long *)0x0) {
          pUVar10 = (UnicodeString *)0x0;
        }
        else {
          *plVar11 = (long)iVar6;
          pUVar10 = (UnicodeString *)(plVar11 + 1);
          lVar12 = 0;
          do {
            *(undefined ***)((long)plVar11 + lVar12 + 8) = &PTR__UnicodeString_0048be70;
            *(undefined2 *)((long)plVar11 + lVar12 + 0x10) = 2;
            lVar12 = lVar12 + 0x40;
          } while (lVar14 != lVar12);
        }
        if (pUVar10 != (UnicodeString *)0x0) {
          *piVar4 = 0;
          local_440[0] = -1;
          pUVar8 = uhash_nextElement_63(local_3a8,local_440);
          while (pUVar8 != (UHashElement *)0x0) {
            pUVar9 = (UnicodeString *)(pUVar8->value).pointer;
            iVar3 = *piVar4;
            *piVar4 = iVar3 + 1;
            icu_63::UnicodeString::operator=(pUVar10 + iVar3,pUVar9);
            pUVar8 = uhash_nextElement_63(local_3a8,local_440);
          }
          goto LAB_00308f8d;
        }
        UVar7 = U_MEMORY_ALLOCATION_ERROR;
      }
      *status = UVar7;
    }
  }
  pUVar10 = (UnicodeString *)0x0;
LAB_00308f8d:
  if (local_350.hash != (UHashtable *)0x0) {
    uhash_close_63(local_350.hash);
  }
  if (local_400.hash != (UHashtable *)0x0) {
    uhash_close_63(local_400.hash);
  }
  if (local_3a8 != (UHashtable *)0x0) {
    uhash_close_63(local_3a8);
  }
  return pUVar10;
}

Assistant:

UnicodeString* CanonicalIterator::getEquivalents(const UnicodeString &segment, int32_t &result_len, UErrorCode &status) {
    Hashtable result(status);
    Hashtable permutations(status);
    Hashtable basic(status);
    if (U_FAILURE(status)) {
        return 0;
    }
    result.setValueDeleter(uprv_deleteUObject);
    permutations.setValueDeleter(uprv_deleteUObject);
    basic.setValueDeleter(uprv_deleteUObject);

    UChar USeg[256];
    int32_t segLen = segment.extract(USeg, 256, status);
    getEquivalents2(&basic, USeg, segLen, status);

    // now get all the permutations
    // add only the ones that are canonically equivalent
    // TODO: optimize by not permuting any class zero.

    const UHashElement *ne = NULL;
    int32_t el = UHASH_FIRST;
    //Iterator it = basic.iterator();
    ne = basic.nextElement(el);
    //while (it.hasNext())
    while (ne != NULL) {
        //String item = (String) it.next();
        UnicodeString item = *((UnicodeString *)(ne->value.pointer));

        permutations.removeAll();
        permute(item, CANITER_SKIP_ZEROES, &permutations, status);
        const UHashElement *ne2 = NULL;
        int32_t el2 = UHASH_FIRST;
        //Iterator it2 = permutations.iterator();
        ne2 = permutations.nextElement(el2);
        //while (it2.hasNext())
        while (ne2 != NULL) {
            //String possible = (String) it2.next();
            //UnicodeString *possible = new UnicodeString(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString possible(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString attempt;
            nfd.normalize(possible, attempt, status);

            // TODO: check if operator == is semanticaly the same as attempt.equals(segment)
            if (attempt==segment) {
                //if (PROGRESS) printf("Adding Permutation: %s\n", UToS(Tr(*possible)));
                // TODO: use the hashtable just to catch duplicates - store strings directly (somehow).
                result.put(possible, new UnicodeString(possible), status); //add(possible);
            } else {
                //if (PROGRESS) printf("-Skipping Permutation: %s\n", UToS(Tr(*possible)));
            }

            ne2 = permutations.nextElement(el2);
        }
        ne = basic.nextElement(el);
    }

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0;
    }
    // convert into a String[] to clean up storage
    //String[] finalResult = new String[result.size()];
    UnicodeString *finalResult = NULL;
    int32_t resultCount;
    if((resultCount = result.count()) != 0) {
        finalResult = new UnicodeString[resultCount];
        if (finalResult == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
    }
    else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    //result.toArray(finalResult);
    result_len = 0;
    el = UHASH_FIRST;
    ne = result.nextElement(el);
    while(ne != NULL) {
        finalResult[result_len++] = *((UnicodeString *)(ne->value.pointer));
        ne = result.nextElement(el);
    }


    return finalResult;
}